

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O2

string * flatbuffers::anon_unknown_0::GenerateFBS
                   (string *__return_storage_ptr__,Parser *parser,string *file_name,bool no_log)

{
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields;
  ushort uVar1;
  ProtoIdGapAction PVar2;
  Namespace *this;
  EnumDef *this_00;
  EnumVal *ev;
  StructDef *__rhs;
  pointer ppFVar3;
  FieldDef *pFVar4;
  ushort *puVar5;
  IDLOptions *pIVar6;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar7;
  pointer ppVar8;
  pointer pbVar9;
  bool bVar10;
  _Rb_tree_node_base *p_Var11;
  Value *pVVar12;
  const_iterator cVar13;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var14;
  undefined1 uVar15;
  ushort *puVar16;
  size_t i;
  ulong uVar17;
  pointer ppFVar18;
  string *psVar19;
  voffset_t vVar20;
  short sVar21;
  int iVar22;
  long lVar23;
  char *__format;
  pointer ppNVar24;
  __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __i;
  pointer ppSVar25;
  pointer __lhs;
  long lVar26;
  pointer ppVar27;
  pointer ppVar28;
  pointer ppEVar29;
  pointer ppEVar30;
  voffset_t proto_id;
  undefined6 uStack_146;
  ushort *local_140;
  string *local_128;
  Parser *local_120;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  proto_ids;
  string basename;
  __node_base_ptr p_Stack_c0;
  byte local_b8;
  string schema;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attributes;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  Namespace *last_namespace;
  pointer local_58;
  string local_50;
  
  pIVar6 = &parser->opts;
  local_128 = __return_storage_ptr__;
  local_120 = parser;
  for (ppNVar24 = (parser->namespaces_).
                  super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppNVar24 !=
      (parser->namespaces_).
      super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppNVar24 = ppNVar24 + 1) {
    this = *ppNVar24;
    lVar23 = -0x20;
    for (uVar17 = 0; parser = local_120, uVar17 < this->from_table; uVar17 = uVar17 + 1) {
      std::__cxx11::string::append
                ((char *)((long)&(((this->components).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                         lVar23));
      lVar23 = lVar23 + -0x20;
    }
    if (((local_120->opts).proto_mode == true) &&
       ((local_120->opts).proto_namespace_suffix._M_string_length != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->components,
               (this->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -this->from_table,
               &pIVar6->proto_namespace_suffix);
    }
  }
  schema._M_dataplus._M_p = (pointer)&schema.field_2;
  schema._M_string_length = 0;
  schema.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proto_id,
                 "// Generated from ",file_name);
  std::operator+(&basename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proto_id,
                 ".proto\n\n");
  std::__cxx11::string::append((string *)&schema);
  std::__cxx11::string::~string((string *)&basename);
  std::__cxx11::string::~string((string *)&proto_id);
  if ((parser->opts).include_dependence_headers == true) {
    pmVar7 = &parser->included_files_;
    iVar22 = 0;
    for (p_Var11 = (parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        parser = local_120,
        (_Rb_tree_header *)p_Var11 != &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      if (p_Var11[1]._M_left != (_Base_ptr)0x0) {
        basename._M_dataplus._M_p = (pointer)&basename.field_2;
        basename._M_string_length = 0;
        basename.field_2._M_allocated_capacity =
             basename.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if ((local_120->opts).keep_prefix == true) {
          StripExtension((string *)&proto_id,(string *)&p_Var11[1]._M_parent);
          std::__cxx11::string::operator=((string *)&basename,(string *)&proto_id);
          psVar19 = (string *)&proto_id;
        }
        else {
          StripExtension((string *)&proto_ids,(string *)&p_Var11[1]._M_parent);
          StripPath((string *)&proto_id,(string *)&proto_ids);
          std::__cxx11::string::operator=((string *)&basename,(string *)&proto_id);
          std::__cxx11::string::~string((string *)&proto_id);
          psVar19 = (string *)&proto_ids;
        }
        std::__cxx11::string::~string((string *)psVar19);
        std::operator+((string *)&proto_ids,"include \"",&basename);
        std::operator+((string *)&proto_id,(string *)&proto_ids,".fbs\";\n");
        std::__cxx11::string::append((string *)&schema);
        std::__cxx11::string::~string((string *)&proto_id);
        std::__cxx11::string::~string((string *)&proto_ids);
        iVar22 = iVar22 + 1;
        std::__cxx11::string::~string((string *)&basename);
      }
    }
    if (iVar22 != 0) {
      std::__cxx11::string::append((char *)&schema);
    }
  }
  last_namespace = (Namespace *)0x0;
  for (ppEVar29 = (parser->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppEVar29 !=
      (local_120->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar29 = ppEVar29 + 1) {
    this_00 = *ppEVar29;
    if (((local_120->opts).include_dependence_headers != true) ||
       ((this_00->super_Definition).generated == false)) {
      GenNameSpace((this_00->super_Definition).defined_namespace,&schema,&last_namespace);
      uVar15 = 0x3d;
      GenComment(&(this_00->super_Definition).doc_comment,&schema,(CommentConfig *)0x0,"");
      if (this_00->is_union == true) {
        std::operator+(&basename,"union ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
        ;
        std::__cxx11::string::append((string *)&schema);
        std::__cxx11::string::~string((string *)&basename);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &proto_id,"enum ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
        ;
        std::operator+(&basename,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &proto_id," : ");
        std::__cxx11::string::append((string *)&schema);
        std::__cxx11::string::~string((string *)&basename);
        std::__cxx11::string::~string((string *)&proto_id);
      }
      (anonymous_namespace)::GenType_abi_cxx11_
                ((string *)&proto_id,(_anonymous_namespace_ *)&this_00->underlying_type,(Type *)0x1,
                 (bool)uVar15);
      std::operator+(&basename,(string *)&proto_id," {\n");
      std::__cxx11::string::append((string *)&schema);
      std::__cxx11::string::~string((string *)&basename);
      std::__cxx11::string::~string((string *)&proto_id);
      for (ppEVar30 = (this_00->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppEVar30 !=
          (this_00->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar30 = ppEVar30 + 1) {
        ev = *ppEVar30;
        uVar15 = 0xcd;
        GenComment(&ev->doc_comment,&schema,(CommentConfig *)0x0,"  ");
        if (this_00->is_union == true) {
          (anonymous_namespace)::GenType_abi_cxx11_
                    ((string *)&proto_ids,(_anonymous_namespace_ *)&ev->union_type,(Type *)0x0,
                     (bool)uVar15);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &proto_id,"  ",(string *)&proto_ids);
          std::operator+(&basename,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &proto_id,",\n");
          std::__cxx11::string::append((string *)&schema);
          std::__cxx11::string::~string((string *)&basename);
          std::__cxx11::string::~string((string *)&proto_id);
          psVar19 = (string *)&proto_ids;
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &attributes,"  ",&ev->name);
          std::operator+((string *)&proto_ids,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &attributes," = ");
          EnumDef::ToString_abi_cxx11_(&local_50,this_00,ev);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &proto_id,(string *)&proto_ids,&local_50);
          std::operator+(&basename,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &proto_id,",\n");
          std::__cxx11::string::append((string *)&schema);
          std::__cxx11::string::~string((string *)&basename);
          std::__cxx11::string::~string((string *)&proto_id);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&proto_ids);
          psVar19 = (string *)&attributes;
        }
        std::__cxx11::string::~string((string *)psVar19);
      }
      std::__cxx11::string::append((char *)&schema);
    }
  }
  ppSVar25 = (local_120->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  psVar19 = local_128;
LAB_0014263b:
  if (ppSVar25 !=
      (local_120->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __rhs = *ppSVar25;
    PVar2 = (local_120->opts).proto_id_gap_action;
    if (((anonymous_namespace)::
         HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
         ::ID_abi_cxx11_ == '\0') &&
       (iVar22 = __cxa_guard_acquire(&(anonymous_namespace)::
                                      HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                                      ::ID_abi_cxx11_), iVar22 != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (anonymous_namespace)::
                 HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                 ::ID_abi_cxx11_,"id",(allocator<char> *)&proto_id);
      __cxa_atexit(std::__cxx11::string::~string,
                   (anonymous_namespace)::
                   HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                   ::ID_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                           ::ID_abi_cxx11_);
    }
    fields = &(__rhs->fields).vec;
    ppFVar3 = (__rhs->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar18 = (__rhs->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppFVar18 != ppFVar3;
        ppFVar18 = ppFVar18 + 1) {
      pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                          (&((*ppFVar18)->super_Definition).attributes,
                           (string *)
                           (anonymous_namespace)::
                           HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                           ::ID_abi_cxx11_);
      if ((pVVar12 != (Value *)0x0) && ((pVVar12->constant)._M_string_length != 0)) {
        if (((anonymous_namespace)::
             HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
             ::ID_abi_cxx11_ == '\0') &&
           (iVar22 = __cxa_guard_acquire(&(anonymous_namespace)::
                                          HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                                          ::ID_abi_cxx11_), iVar22 != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (anonymous_namespace)::
                     HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                     ::ID_abi_cxx11_,"id",(allocator<char> *)&proto_id);
          __cxa_atexit(std::__cxx11::string::~string,
                       (anonymous_namespace)::
                       HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                       ::ID_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                               ::ID_abi_cxx11_);
        }
        ppFVar18 = (__rhs->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar3 = (__rhs->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_00142a6d;
      }
    }
    basename._M_dataplus._M_p = (pointer)&p_Stack_c0;
    basename._M_string_length = 1;
    basename.field_2._M_allocated_capacity = 0;
    basename.field_2._8_8_ = 0;
    p_Stack_c0 = (__node_base_ptr)0x0;
    local_b8 = 1;
    psVar19 = local_128;
    goto LAB_00142700;
  }
  (psVar19->_M_dataplus)._M_p = (pointer)&psVar19->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)schema._M_dataplus._M_p == &schema.field_2) {
    (psVar19->field_2)._M_allocated_capacity =
         CONCAT71(schema.field_2._M_allocated_capacity._1_7_,schema.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&psVar19->field_2 + 8) = schema.field_2._8_8_;
  }
  else {
    (psVar19->_M_dataplus)._M_p = schema._M_dataplus._M_p;
    (psVar19->field_2)._M_allocated_capacity =
         CONCAT71(schema.field_2._M_allocated_capacity._1_7_,schema.field_2._M_local_buf[0]);
  }
  psVar19->_M_string_length = schema._M_string_length;
  schema._M_string_length = 0;
  schema.field_2._M_local_buf[0] = '\0';
  schema._M_dataplus._M_p = (pointer)&schema.field_2;
LAB_00143028:
  std::__cxx11::string::~string((string *)&schema);
  return psVar19;
LAB_00142a6d:
  if (ppFVar18 == ppFVar3) goto LAB_00142ab1;
  pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                      (&((*ppFVar18)->super_Definition).attributes,
                       (string *)
                       (anonymous_namespace)::
                       HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                       ::ID_abi_cxx11_);
  if ((pVVar12 != (Value *)0x0) && ((pVVar12->constant)._M_string_length != 0)) {
    proto_id = 0;
    bVar10 = StringToNumber<unsigned_short>
                       ((pVVar12->constant)._M_dataplus._M_p,(unsigned_short *)&proto_id);
    if (!bVar10) {
      psVar19 = local_128;
      if (no_log) goto LAB_00142fd1;
      __format = "Field id in struct %s has a non positive number value\n";
      goto LAB_00142fb9;
    }
  }
  ppFVar18 = ppFVar18 + 1;
  goto LAB_00142a6d;
LAB_00142ab1:
  ExtractProtobufIds((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&proto_id,fields);
  psVar19 = local_128;
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT62(uStack_146,proto_id),local_140);
  puVar5 = (ushort *)CONCAT62(uStack_146,proto_id);
  while (puVar16 = puVar5 + 1, puVar16 != local_140) {
    uVar1 = *puVar5;
    puVar5 = puVar16;
    if (*puVar16 == uVar1) {
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&proto_id);
      if (no_log) goto LAB_00142fd1;
      __format = "Fields in struct %s have used an id twice\n";
      goto LAB_00142fb9;
    }
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&proto_id);
  if (((anonymous_namespace)::
       HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
       ::ID_abi_cxx11_ == '\0') &&
     (iVar22 = __cxa_guard_acquire(&(anonymous_namespace)::
                                    HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
                                    ::ID_abi_cxx11_), iVar22 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               (anonymous_namespace)::
               HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
               ::ID_abi_cxx11_,"id",(allocator<char> *)&proto_id);
    __cxa_atexit(std::__cxx11::string::~string,
                 (anonymous_namespace)::
                 HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
                 ::ID_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
                         ::ID_abi_cxx11_);
  }
  ppFVar3 = (__rhs->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar18 = (__rhs->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar19 = local_128,
      ppFVar18 != ppFVar3; ppFVar18 = ppFVar18 + 1) {
    pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                        (&((*ppFVar18)->super_Definition).attributes,
                         (string *)
                         (anonymous_namespace)::
                         HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
                         ::ID_abi_cxx11_);
    if ((pVVar12 != (Value *)0x0) && ((pVVar12->constant)._M_string_length != 0)) {
      proto_id = 0;
      bVar10 = StringToNumber<unsigned_short>
                         ((pVVar12->constant)._M_dataplus._M_p,(unsigned_short *)&proto_id);
      if ((!bVar10) ||
         (_Var14 = std::
                   __find_if<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                             ((__rhs->reserved_ids).
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (__rhs->reserved_ids).
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &proto_id),
         _Var14._M_current !=
         (__rhs->reserved_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_finish)) {
        psVar19 = local_128;
        if (!no_log) {
          __format = "Fields in struct %s use id from reserved ids\n";
LAB_00142fb9:
          fprintf(_stderr,__format,(__rhs->super_Definition).name._M_dataplus._M_p);
        }
        goto LAB_00142fd1;
      }
    }
  }
  if (PVar2 != NO_OP) {
    ExtractProtobufIds((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&proto_id,fields);
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (CONCAT62(uStack_146,proto_id),local_140);
    puVar5 = (ushort *)CONCAT62(uStack_146,proto_id);
    do {
      puVar16 = puVar5 + 1;
      if (puVar16 == local_140) {
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                  ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&proto_id);
        goto LAB_00142c05;
      }
      uVar1 = *puVar5;
      puVar5 = puVar16;
    } while (uVar1 + 1 == (uint)*puVar16);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&proto_id);
    if (!no_log) {
      fprintf(_stderr,"Fields in struct %s have gap between ids\n",
              (__rhs->super_Definition).name._M_dataplus._M_p);
    }
    if (PVar2 == ERROR) {
LAB_00142fd1:
      basename._M_dataplus._M_p = (pointer)&p_Stack_c0;
      basename._M_string_length = 1;
      basename.field_2._M_allocated_capacity = 0;
      basename.field_2._8_8_ = 0;
      p_Stack_c0 = (__node_base_ptr)0x0;
      local_b8 = 0;
      goto LAB_0014300e;
    }
  }
LAB_00142c05:
  proto_ids.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  proto_ids.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  proto_ids.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = (__rhs->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar18 = (__rhs->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppVar28 = proto_ids.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      ppVar8 = proto_ids.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, ppFVar18 != local_58;
      ppFVar18 = ppFVar18 + 1) {
    pFVar4 = *ppFVar18;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proto_id,"id",(allocator<char> *)&attributes);
    pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                        (&(pFVar4->super_Definition).attributes,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &proto_id);
    std::__cxx11::string::~string((string *)&proto_id);
    if (pVVar12 == (Value *)0x0) {
      if (!no_log) {
        fprintf(_stderr,"Fields id in struct %s is missing\n",
                (__rhs->super_Definition).name._M_dataplus._M_p);
      }
      basename._M_dataplus._M_p = (pointer)&p_Stack_c0;
      basename._M_string_length = 1;
      basename.field_2._M_allocated_capacity = 0;
      basename.field_2._8_8_ = 0;
      p_Stack_c0 = (__node_base_ptr)0x0;
      local_b8 = 0;
      goto LAB_00142e02;
    }
    if (((pVVar12->constant)._M_string_length == 0) &&
       ((pFVar4->value).type.base_type == BASE_TYPE_UNION)) {
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<int_const&,std::__cxx11::string_const&>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)&proto_ids,
                 &(anonymous_namespace)::
                  MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)
                  ::UNION_ID,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
    }
    else {
      proto_id = 0;
      StringToNumber<unsigned_short>
                ((pVVar12->constant)._M_dataplus._M_p,(unsigned_short *)&proto_id);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<unsigned_short&,std::__cxx11::string_const&>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)&proto_ids,(unsigned_short *)&proto_id,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4);
    }
  }
  if (proto_ids.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      proto_ids.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar26 = (long)proto_ids.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)proto_ids.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = lVar26 / 0x28;
    lVar23 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
              (proto_ids.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               proto_ids.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar26 < 0x281) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                (ppVar8,ppVar28);
    }
    else {
      ppVar27 = ppVar8 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                (ppVar8,ppVar27);
      for (; ppVar27 != ppVar28; ppVar27 = ppVar27 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Val_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                  (ppVar27);
      }
    }
  }
  ppVar8 = proto_ids.
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  basename._M_dataplus._M_p = (pointer)&p_Stack_c0;
  basename._M_string_length = 1;
  basename.field_2._M_allocated_capacity = 0;
  basename.field_2._8_8_ = 0;
  p_Stack_c0 = (__node_base_ptr)0x0;
  local_b8 = 0;
  sVar21 = 0;
  for (ppVar28 = proto_ids.
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar28 != ppVar8; ppVar28 = ppVar28 + 1
      ) {
    vVar20 = sVar21 + (ushort)(ppVar28->first == -1);
    proto_id = vVar20;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,unsigned_short>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&basename,&ppVar28->second,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proto_id);
    sVar21 = vVar20 + 1;
  }
  local_b8 = 1;
LAB_00142e02:
  psVar19 = local_128;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&proto_ids);
  if ((local_b8 & 1) != 0) {
LAB_00142700:
    if (((local_120->opts).include_dependence_headers != true) ||
       ((__rhs->super_Definition).generated == false)) {
      GenNameSpace((__rhs->super_Definition).defined_namespace,&schema,&last_namespace);
      GenComment(&(__rhs->super_Definition).doc_comment,&schema,(CommentConfig *)0x0,"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proto_ids
                     ,"table ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proto_id,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proto_ids
                     ," {\n");
      std::__cxx11::string::append((string *)&schema);
      std::__cxx11::string::~string((string *)&proto_id);
      std::__cxx11::string::~string((string *)&proto_ids);
      for (ppFVar18 = (fields->
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          ppFVar18 !=
          (__rhs->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar18 = ppFVar18 + 1) {
        pFVar4 = *ppFVar18;
        if ((pFVar4->value).type.base_type != BASE_TYPE_UTYPE) {
          uVar15 = 0xcd;
          GenComment(&(pFVar4->super_Definition).doc_comment,&schema,(CommentConfig *)0x0,"  ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &attributes,"  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar4
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &proto_ids,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &attributes,":");
          (anonymous_namespace)::GenType_abi_cxx11_
                    (&local_50,(_anonymous_namespace_ *)&pFVar4->value,(Type *)0x0,(bool)uVar15);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &proto_id,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &proto_ids,&local_50);
          std::__cxx11::string::append((string *)&schema);
          std::__cxx11::string::~string((string *)&proto_id);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&proto_ids);
          std::__cxx11::string::~string((string *)&attributes);
          psVar19 = &(pFVar4->value).constant;
          bVar10 = std::operator!=(psVar19,"0");
          if (bVar10) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &proto_id," = ",psVar19);
            std::__cxx11::string::append((string *)&schema);
            std::__cxx11::string::~string((string *)&proto_id);
          }
          attributes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          attributes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          attributes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if (pFVar4->presence == kRequired) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&proto_id,"required",(allocator<char> *)&proto_ids);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &attributes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &proto_id);
            std::__cxx11::string::~string((string *)&proto_id);
          }
          if (pFVar4->key == true) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&proto_id,"key",(allocator<char> *)&proto_ids);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &attributes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &proto_id);
            std::__cxx11::string::~string((string *)&proto_id);
          }
          if (((local_120->opts).keep_proto_id == true) &&
             (cVar13 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&basename,(key_type *)pFVar4),
             cVar13.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
             ._M_cur != (__node_type *)0x0)) {
            NumToString<unsigned_short>
                      ((string *)&proto_ids,
                       *(unsigned_short *)
                        ((long)cVar13.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
                               ._M_cur + 0x28));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &proto_id,"id: ",(string *)&proto_ids);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &attributes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &proto_id);
            std::__cxx11::string::~string((string *)&proto_id);
            std::__cxx11::string::~string((string *)&proto_ids);
          }
          if (attributes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              attributes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::append((char *)&schema);
            pbVar9 = attributes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (__lhs = attributes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar9;
                __lhs = __lhs + 1) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &proto_id,__lhs,",");
              std::__cxx11::string::append((string *)&schema);
              std::__cxx11::string::~string((string *)&proto_id);
            }
            std::__cxx11::string::pop_back();
            std::__cxx11::string::append((char *)&schema);
          }
          std::__cxx11::string::append((char *)&schema);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&attributes);
        }
      }
      std::__cxx11::string::append((char *)&schema);
      psVar19 = local_128;
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&basename);
    ppSVar25 = ppSVar25 + 1;
    goto LAB_0014263b;
  }
LAB_0014300e:
  (psVar19->_M_dataplus)._M_p = (pointer)&psVar19->field_2;
  psVar19->_M_string_length = 0;
  (psVar19->field_2)._M_local_buf[0] = '\0';
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&basename);
  goto LAB_00143028;
}

Assistant:

static std::string GenerateFBS(const Parser &parser,
                               const std::string &file_name,
                               bool no_log = false) {
  // Proto namespaces may clash with table names, escape the ones that were
  // generated from a table:
  for (auto it = parser.namespaces_.begin(); it != parser.namespaces_.end();
       ++it) {
    auto &ns = **it;
    for (size_t i = 0; i < ns.from_table; i++) {
      ns.components[ns.components.size() - 1 - i] += "_";
    }

    if (parser.opts.proto_mode && !parser.opts.proto_namespace_suffix.empty()) {
      // Since we know that all these namespaces come from a .proto, and all are
      // being converted, we can simply apply this suffix to all of them.
      ns.components.insert(ns.components.end() - ns.from_table,
                           parser.opts.proto_namespace_suffix);
    }
  }

  std::string schema;
  schema += "// Generated from " + file_name + ".proto\n\n";
  if (parser.opts.include_dependence_headers) {
    // clang-format off
    int num_includes = 0;
    for (auto it = parser.included_files_.begin();
         it != parser.included_files_.end(); ++it) {
      if (it->second.empty()) {
        continue;
}
      std::string basename;
      if(parser.opts.keep_prefix) {
        basename = flatbuffers::StripExtension(it->second);
      } else {
        basename = flatbuffers::StripPath(
                flatbuffers::StripExtension(it->second));
      }
      schema += "include \"" + basename + ".fbs\";\n";
      num_includes++;
    }
    if (num_includes) schema += "\n";
    // clang-format on
  }

  // Generate code for all the enum declarations.
  const Namespace *last_namespace = nullptr;
  for (auto enum_def_it = parser.enums_.vec.begin();
       enum_def_it != parser.enums_.vec.end(); ++enum_def_it) {
    EnumDef &enum_def = **enum_def_it;
    if (parser.opts.include_dependence_headers && enum_def.generated) {
      continue;
    }
    GenNameSpace(*enum_def.defined_namespace, &schema, &last_namespace);
    GenComment(enum_def.doc_comment, &schema, nullptr);
    if (enum_def.is_union) {
      schema += "union " + enum_def.name;
    } else {
      schema += "enum " + enum_def.name + " : ";
    }

    schema += GenType(enum_def.underlying_type, true) + " {\n";

    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, &schema, nullptr, "  ");
      if (enum_def.is_union) {
        schema += "  " + GenType(ev.union_type) + ",\n";
      } else {
        schema += "  " + ev.name + " = " + enum_def.ToString(ev) + ",\n";
      }
    }
    schema += "}\n\n";
  }
  // Generate code for all structs/tables.
  for (auto it = parser.structs_.vec.begin(); it != parser.structs_.vec.end();
       ++it) {
    StructDef &struct_def = **it;
    const auto proto_fbs_ids = MapProtoIdsToFieldsId(
        struct_def, parser.opts.proto_id_gap_action, no_log);
    if (!proto_fbs_ids.successful) { return {}; }

    if (parser.opts.include_dependence_headers && struct_def.generated) {
      continue;
    }

    GenNameSpace(*struct_def.defined_namespace, &schema, &last_namespace);
    GenComment(struct_def.doc_comment, &schema, nullptr);
    schema += "table " + struct_def.name + " {\n";
    for (auto field_it = struct_def.fields.vec.begin();
         field_it != struct_def.fields.vec.end(); ++field_it) {
      auto &field = **field_it;
      if (field.value.type.base_type != BASE_TYPE_UTYPE) {
        GenComment(field.doc_comment, &schema, nullptr, "  ");
        schema += "  " + field.name + ":" + GenType(field.value.type);
        if (field.value.constant != "0") schema += " = " + field.value.constant;
        std::vector<std::string> attributes;
        if (field.IsRequired()) attributes.push_back("required");
        if (field.key) attributes.push_back("key");

        if (parser.opts.keep_proto_id) {
          auto it = proto_fbs_ids.field_to_id.find(field.name);
          if (it != proto_fbs_ids.field_to_id.end()) {
            attributes.push_back("id: " + NumToString(it->second));
          }  // If not found it means we do not have any ids
        }

        if (!attributes.empty()) {
          schema += " (";
          for (const auto &attribute : attributes) {
            schema += attribute + ",";
          }
          schema.pop_back();
          schema += ")";
        }

        schema += ";\n";
      }
    }
    schema += "}\n\n";
  }
  return schema;
}